

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionNot_x_iutest_x_Arithmetic_Test::Body(iu_ExpressionNot_x_iutest_x_Arithmetic_Test *this)

{
  char *in_R9;
  int local_278;
  int local_274;
  undefined1 local_270 [40];
  iuCodeMessage local_248;
  AssertionResult iutest_ar;
  undefined1 local_1f0 [40];
  int local_1c8 [2];
  undefined1 local_1c0 [40];
  Fixed local_198;
  
  local_1c0._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_1f0,(int *)local_1c0);
  local_274 = 2;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,&local_274);
  local_278 = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,&local_278);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + 2 == 1))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x74,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1c0._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_1f0,(int *)local_1c0);
  local_274 = 2;
  iutest::detail::ExpressionLHS<int>::operator-<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,&local_274);
  local_278 = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,&local_278);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() - 2 == 1))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x75,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1c0._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_1f0,(int *)local_1c0);
  local_274 = 2;
  iutest::detail::ExpressionLHS<int>::operator*<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,&local_274);
  local_278 = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,&local_278);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() * 2 == 1))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x76,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1c0._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_1f0,(int *)local_1c0);
  local_274 = 2;
  iutest::detail::ExpressionLHS<int>::operator/<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,&local_274);
  local_278 = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,&local_278);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() / 2 == 1))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x77,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1c0._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_1f0,(int *)local_1c0);
  local_274 = 4;
  iutest::detail::ExpressionLHS<int>::operator%<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,&local_274);
  local_278 = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,&local_278);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() % 4 == 1))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x78,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_274 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1c0,&local_274);
  local_278 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_1f0,(ExpressionLHS<int> *)local_1c0,&local_278);
  local_1c8[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_270,(ExpressionLHS<int> *)local_1f0,local_1c8 + 1);
  local_1c8[0] = 1;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_248,(ExpressionLHS<int> *)local_270,local_1c8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_248,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + f() + f() == 1))",
               "false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x79,(char *)local_270._0_8_);
    local_248._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_248,&local_198);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)local_270);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(ExpressionNot, Arithmetic)
{
    IUTEST_EXPECT_NOT(f() + 2 == 1);
    IUTEST_EXPECT_NOT(f() - 2 == 1);
    IUTEST_EXPECT_NOT(f() * 2 == 1);
    IUTEST_EXPECT_NOT(f() / 2 == 1);
    IUTEST_EXPECT_NOT(f() % 4 == 1);
    IUTEST_EXPECT_NOT(f() + f() + f() == 1);
}